

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

int tcu::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ConstPixelBufferAccess *pCVar1;
  bool bVar2;
  int extraout_EAX;
  int stencil;
  int extraout_EAX_00;
  TextureFormat *pTVar3;
  TextureFormat *pTVar4;
  undefined7 extraout_var;
  void *pvVar5;
  void *pvVar6;
  float depth_00;
  bool local_e2;
  bool local_e1;
  bool local_b0;
  bool local_af;
  bool local_ae;
  bool local_ad;
  undefined1 local_ac [24];
  int x_4;
  int y_5;
  int z_5;
  int local_80;
  int local_7c;
  int x_3;
  int y_4;
  int z_4;
  bool dstIsInt;
  TextureChannelClass TStack_6c;
  bool srcIsInt;
  TextureChannelClass dstClass;
  TextureChannelClass srcClass;
  int x_2;
  int y_3;
  int z_3;
  int x_1;
  int y_2;
  int z_2;
  int x;
  int y_1;
  int z_1;
  int y;
  int z;
  bool dstHasStencil;
  int iStack_34;
  bool dstHasDepth;
  bool srcHasStencil;
  bool srcHasDepth;
  bool dstTightlyPacked;
  bool srcTightlyPacked;
  int dstPixelPitch;
  int srcPixelPitch;
  int dstPixelSize;
  int srcPixelSize;
  int depth;
  int height;
  int width;
  ConstPixelBufferAccess *src_local;
  PixelBufferAccess *dst_local;
  
  _height = (ConstPixelBufferAccess *)src;
  src_local = (ConstPixelBufferAccess *)dst;
  depth = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)dst);
  srcPixelSize = ConstPixelBufferAccess::getHeight(src_local);
  dstPixelSize = ConstPixelBufferAccess::getDepth(src_local);
  pTVar3 = ConstPixelBufferAccess::getFormat(_height);
  srcPixelPitch = TextureFormat::getPixelSize(pTVar3);
  pTVar3 = ConstPixelBufferAccess::getFormat(src_local);
  dstPixelPitch = TextureFormat::getPixelSize(pTVar3);
  _srcHasStencil = ConstPixelBufferAccess::getPixelPitch(_height);
  iStack_34 = ConstPixelBufferAccess::getPixelPitch(src_local);
  z._3_1_ = srcPixelPitch == _srcHasStencil;
  z._2_1_ = dstPixelPitch == iStack_34;
  pTVar3 = ConstPixelBufferAccess::getFormat(_height);
  local_ad = true;
  if (pTVar3->order != DS) {
    pTVar3 = ConstPixelBufferAccess::getFormat(_height);
    local_ad = pTVar3->order == D;
  }
  z._1_1_ = local_ad;
  pTVar3 = ConstPixelBufferAccess::getFormat(_height);
  local_ae = true;
  if (pTVar3->order != DS) {
    pTVar3 = ConstPixelBufferAccess::getFormat(_height);
    local_ae = pTVar3->order == S;
  }
  z._0_1_ = local_ae;
  pTVar3 = ConstPixelBufferAccess::getFormat(src_local);
  local_af = true;
  if (pTVar3->order != DS) {
    pTVar3 = ConstPixelBufferAccess::getFormat(src_local);
    local_af = pTVar3->order == D;
  }
  y._3_1_ = local_af;
  pTVar3 = ConstPixelBufferAccess::getFormat(src_local);
  local_b0 = true;
  if (pTVar3->order != DS) {
    pTVar3 = ConstPixelBufferAccess::getFormat(src_local);
    local_b0 = pTVar3->order == S;
  }
  y._2_1_ = local_b0;
  pTVar3 = ConstPixelBufferAccess::getFormat(_height);
  pTVar4 = ConstPixelBufferAccess::getFormat(src_local);
  bVar2 = TextureFormat::operator==(pTVar3,pTVar4);
  if (((bVar2) && ((z._3_1_ & 1) != 0)) && ((z._2_1_ & 1) != 0)) {
    for (z_1 = 0; z_1 < dstPixelSize; z_1 = z_1 + 1) {
      for (y_1 = 0; y_1 < srcPixelSize; y_1 = y_1 + 1) {
        pvVar5 = PixelBufferAccess::getPixelPtr((PixelBufferAccess *)src_local,0,y_1,z_1);
        pvVar6 = ConstPixelBufferAccess::getPixelPtr(_height,0,y_1,z_1);
        ::deMemcpy(pvVar5,pvVar6,(long)(srcPixelPitch * depth));
      }
    }
  }
  else {
    pTVar3 = ConstPixelBufferAccess::getFormat(_height);
    pTVar4 = ConstPixelBufferAccess::getFormat(src_local);
    bVar2 = TextureFormat::operator==(pTVar3,pTVar4);
    z_1 = (int)CONCAT71(extraout_var,bVar2);
    if (bVar2) {
      for (x = 0; z_1 = x, x < dstPixelSize; x = x + 1) {
        for (z_2 = 0; z_2 < srcPixelSize; z_2 = z_2 + 1) {
          for (y_2 = 0; y_2 < depth; y_2 = y_2 + 1) {
            pvVar5 = PixelBufferAccess::getPixelPtr((PixelBufferAccess *)src_local,y_2,z_2,x);
            pvVar6 = ConstPixelBufferAccess::getPixelPtr(_height,y_2,z_2,x);
            ::deMemcpy(pvVar5,pvVar6,(long)srcPixelPitch);
          }
        }
      }
    }
    else if ((((z._1_1_ & 1) == 0) && (((byte)z & 1) == 0)) &&
            (((y._3_1_ & 1) == 0 && ((y._2_1_ & 1) == 0)))) {
      pTVar3 = ConstPixelBufferAccess::getFormat(_height);
      TStack_6c = getTextureChannelClass(pTVar3->type);
      pTVar3 = ConstPixelBufferAccess::getFormat(src_local);
      z_4 = getTextureChannelClass(pTVar3->type);
      local_e1 = TStack_6c == TEXTURECHANNELCLASS_SIGNED_INTEGER ||
                 TStack_6c == TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
      y_4._3_1_ = local_e1;
      local_e2 = z_4 == TEXTURECHANNELCLASS_SIGNED_INTEGER ||
                 z_4 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
      y_4._2_1_ = local_e2;
      if ((TStack_6c == TEXTURECHANNELCLASS_SIGNED_INTEGER ||
           TStack_6c == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) &&
         (z_4 == TEXTURECHANNELCLASS_SIGNED_INTEGER || z_4 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER))
      {
        for (x_3 = 0; z_1 = x_3, x_3 < dstPixelSize; x_3 = x_3 + 1) {
          for (local_7c = 0; local_7c < srcPixelSize; local_7c = local_7c + 1) {
            for (local_80 = 0; pCVar1 = src_local, local_80 < depth; local_80 = local_80 + 1) {
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)&y_5,(int)_height,local_80,local_7c);
              PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)pCVar1,(IVec4 *)&y_5,local_80,local_7c,x_3);
            }
          }
        }
      }
      else {
        for (x_4 = 0; z_1 = x_4, x_4 < dstPixelSize; x_4 = x_4 + 1) {
          for (local_ac._20_4_ = 0; (int)local_ac._20_4_ < srcPixelSize;
              local_ac._20_4_ = local_ac._20_4_ + 1) {
            for (local_ac._16_4_ = 0; pCVar1 = src_local, (int)local_ac._16_4_ < depth;
                local_ac._16_4_ = local_ac._16_4_ + 1) {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_ac,(int)_height,local_ac._16_4_,
                         local_ac._20_4_);
              PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)pCVar1,(Vec4 *)local_ac,local_ac._16_4_,
                         local_ac._20_4_,x_4);
            }
          }
        }
      }
    }
    else {
      if (((y._3_1_ & 1) == 0) || ((z._1_1_ & 1) == 0)) {
        if (((y._3_1_ & 1) != 0) && ((z._1_1_ & 1) == 0)) {
          clearDepth((PixelBufferAccess *)src_local,0.0);
          z_1 = extraout_EAX;
        }
      }
      else {
        for (x_1 = 0; z_1 = x_1, x_1 < dstPixelSize; x_1 = x_1 + 1) {
          for (z_3 = 0; z_3 < srcPixelSize; z_3 = z_3 + 1) {
            for (y_3 = 0; pCVar1 = src_local, y_3 < depth; y_3 = y_3 + 1) {
              depth_00 = ConstPixelBufferAccess::getPixDepth(_height,y_3,z_3,x_1);
              PixelBufferAccess::setPixDepth((PixelBufferAccess *)pCVar1,depth_00,y_3,z_3,x_1);
            }
          }
        }
      }
      if (((y._2_1_ & 1) == 0) || (((byte)z & 1) == 0)) {
        if (((y._2_1_ & 1) != 0) && (((byte)z & 1) == 0)) {
          clearStencil((PixelBufferAccess *)src_local,0);
          z_1 = extraout_EAX_00;
        }
      }
      else {
        for (x_2 = 0; z_1 = x_2, x_2 < dstPixelSize; x_2 = x_2 + 1) {
          for (srcClass = TEXTURECHANNELCLASS_SIGNED_FIXED_POINT; (int)srcClass < srcPixelSize;
              srcClass = srcClass + TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
            for (dstClass = TEXTURECHANNELCLASS_SIGNED_FIXED_POINT; pCVar1 = src_local,
                (int)dstClass < depth;
                dstClass = dstClass + TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
              stencil = ConstPixelBufferAccess::getPixStencil(_height,dstClass,srcClass,x_2);
              PixelBufferAccess::setPixStencil
                        ((PixelBufferAccess *)pCVar1,stencil,dstClass,srcClass,x_2);
            }
          }
        }
      }
    }
  }
  return z_1;
}

Assistant:

void copy (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src)
{
	DE_ASSERT(src.getSize() == dst.getSize());

	const int	width				= dst.getWidth();
	const int	height				= dst.getHeight();
	const int	depth				= dst.getDepth();

	const int	srcPixelSize		= src.getFormat().getPixelSize();
	const int	dstPixelSize		= dst.getFormat().getPixelSize();
	const int	srcPixelPitch		= src.getPixelPitch();
	const int	dstPixelPitch		= dst.getPixelPitch();
	const bool	srcTightlyPacked	= (srcPixelSize == srcPixelPitch);
	const bool	dstTightlyPacked	= (dstPixelSize == dstPixelPitch);

	const bool	srcHasDepth			= (src.getFormat().order == tcu::TextureFormat::DS || src.getFormat().order == tcu::TextureFormat::D);
	const bool	srcHasStencil		= (src.getFormat().order == tcu::TextureFormat::DS || src.getFormat().order == tcu::TextureFormat::S);
	const bool	dstHasDepth			= (dst.getFormat().order == tcu::TextureFormat::DS || dst.getFormat().order == tcu::TextureFormat::D);
	const bool	dstHasStencil		= (dst.getFormat().order == tcu::TextureFormat::DS || dst.getFormat().order == tcu::TextureFormat::S);

	if (src.getFormat() == dst.getFormat() && srcTightlyPacked && dstTightlyPacked)
	{
		// Fast-path for matching formats.
		for (int z = 0; z < depth; z++)
		for (int y = 0; y < height; y++)
			deMemcpy(dst.getPixelPtr(0, y, z), src.getPixelPtr(0, y, z), srcPixelSize*width);
	}
	else if (src.getFormat() == dst.getFormat())
	{
		// Bit-exact copy for matching formats.
		for (int z = 0; z < depth; z++)
		for (int y = 0; y < height; y++)
		for (int x = 0; x < width; x++)
			deMemcpy(dst.getPixelPtr(x, y, z), src.getPixelPtr(x, y, z), srcPixelSize);
	}
	else if (srcHasDepth || srcHasStencil || dstHasDepth || dstHasStencil)
	{
		DE_ASSERT((srcHasDepth && dstHasDepth) || (srcHasStencil && dstHasStencil)); // must have at least one common channel

		if (dstHasDepth && srcHasDepth)
		{
			for (int z = 0; z < depth; z++)
			for (int y = 0; y < height; y++)
			for (int x = 0; x < width; x++)
				dst.setPixDepth(src.getPixDepth(x, y, z), x, y, z);
		}
		else if (dstHasDepth && !srcHasDepth)
		{
			// consistency with color copies
			tcu::clearDepth(dst, 0.0f);
		}

		if (dstHasStencil && srcHasStencil)
		{
			for (int z = 0; z < depth; z++)
			for (int y = 0; y < height; y++)
			for (int x = 0; x < width; x++)
				dst.setPixStencil(src.getPixStencil(x, y, z), x, y, z);
		}
		else if (dstHasStencil && !srcHasStencil)
		{
			// consistency with color copies
			tcu::clearStencil(dst, 0u);
		}
	}
	else
	{
		TextureChannelClass		srcClass	= getTextureChannelClass(src.getFormat().type);
		TextureChannelClass		dstClass	= getTextureChannelClass(dst.getFormat().type);
		bool					srcIsInt	= srcClass == TEXTURECHANNELCLASS_SIGNED_INTEGER || srcClass == TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
		bool					dstIsInt	= dstClass == TEXTURECHANNELCLASS_SIGNED_INTEGER || dstClass == TEXTURECHANNELCLASS_UNSIGNED_INTEGER;

		if (srcIsInt && dstIsInt)
		{
			for (int z = 0; z < depth; z++)
			for (int y = 0; y < height; y++)
			for (int x = 0; x < width; x++)
				dst.setPixel(src.getPixelInt(x, y, z), x, y, z);
		}
		else
		{
			for (int z = 0; z < depth; z++)
			for (int y = 0; y < height; y++)
			for (int x = 0; x < width; x++)
				dst.setPixel(src.getPixel(x, y, z), x, y, z);
		}
	}
}